

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attributes.c
# Opt level: O0

exr_result_t attr_destroy(_internal_exr_context *ctxt,exr_attribute_t *attr)

{
  exr_attr_preview_t *in_RSI;
  exr_context_t in_RDI;
  exr_attr_string_vector_t *unaff_retaddr;
  exr_context_t in_stack_00000008;
  exr_attr_opaquedata_t *in_stack_00000010;
  exr_result_t rv;
  exr_result_t local_14;
  
  local_14 = 0;
  switch(*(undefined4 *)((long)&in_RSI->rgba + 4)) {
  case 0:
  case 1:
  case 2:
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x12:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1e:
    break;
  case 3:
    local_14 = exr_attr_chlist_destroy(in_stack_00000008,(exr_attr_chlist_t *)unaff_retaddr);
    break;
  case 9:
    local_14 = exr_attr_float_vector_destroy(in_RDI,(exr_attr_float_vector_t *)in_RSI);
    break;
  case 0x11:
    local_14 = exr_attr_preview_destroy(in_RDI,in_RSI);
    break;
  case 0x13:
    local_14 = exr_attr_string_destroy(in_RDI,(exr_attr_string_t *)in_RSI);
    break;
  case 0x14:
    local_14 = exr_attr_string_vector_destroy(in_stack_00000008,unaff_retaddr);
    break;
  case 0x1d:
    local_14 = exr_attr_opaquedata_destroy((exr_context_t)attr,in_stack_00000010);
  }
  (**(code **)(in_RDI + 0x60))(in_RSI);
  return local_14;
}

Assistant:

static exr_result_t
attr_destroy (struct _internal_exr_context* ctxt, exr_attribute_t* attr)
{
    exr_result_t rv = EXR_ERR_SUCCESS;
    switch (attr->type)
    {
        case EXR_ATTR_CHLIST:
            rv = exr_attr_chlist_destroy ((exr_context_t) ctxt, attr->chlist);
            break;
        case EXR_ATTR_FLOAT_VECTOR:
            rv = exr_attr_float_vector_destroy (
                (exr_context_t) ctxt, attr->floatvector);
            break;
        case EXR_ATTR_PREVIEW:
            rv = exr_attr_preview_destroy ((exr_context_t) ctxt, attr->preview);
            break;
        case EXR_ATTR_STRING:
            rv = exr_attr_string_destroy ((exr_context_t) ctxt, attr->string);
            break;
        case EXR_ATTR_STRING_VECTOR:
            rv = exr_attr_string_vector_destroy (
                (exr_context_t) ctxt, attr->stringvector);
            break;
        case EXR_ATTR_OPAQUE:
            rv = exr_attr_opaquedata_destroy (
                (exr_context_t) ctxt, attr->opaque);
            break;
        case EXR_ATTR_BOX2I:
        case EXR_ATTR_BOX2F:
        case EXR_ATTR_CHROMATICITIES:
        case EXR_ATTR_COMPRESSION:
        case EXR_ATTR_ENVMAP:
        case EXR_ATTR_LINEORDER:
        case EXR_ATTR_DOUBLE:
        case EXR_ATTR_FLOAT:
        case EXR_ATTR_INT:
        case EXR_ATTR_KEYCODE:
        case EXR_ATTR_M33F:
        case EXR_ATTR_M33D:
        case EXR_ATTR_M44F:
        case EXR_ATTR_M44D:
        case EXR_ATTR_RATIONAL:
        case EXR_ATTR_TILEDESC:
        case EXR_ATTR_TIMECODE:
        case EXR_ATTR_V2I:
        case EXR_ATTR_V2F:
        case EXR_ATTR_V2D:
        case EXR_ATTR_V3I:
        case EXR_ATTR_V3F:
        case EXR_ATTR_V3D:
        case EXR_ATTR_UNKNOWN:
        case EXR_ATTR_LAST_KNOWN_TYPE:
        default: break;
    }
    /* we don't care about the string because they were built into the
     * allocation block of the attribute as necessary */
    ctxt->free_fn (attr);
    return rv;
}